

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sxmlsearch.c
# Opt level: O0

SXML_CHAR * XMLSearch_get_XPath_string(XMLSearch *search,SXML_CHAR **xpath,SXML_CHAR quote)

{
  bool bVar1;
  char *pcVar2;
  SXML_CHAR *pSVar3;
  char *local_50;
  int local_38;
  int fill;
  int i;
  SXML_CHAR squote [2];
  XMLSearch *s;
  SXML_CHAR quote_local;
  SXML_CHAR **xpath_local;
  XMLSearch *search_local;
  
  fill._2_2_ = 0x27;
  if (xpath == (SXML_CHAR **)0x0) {
    search_local = (XMLSearch *)0x0;
  }
  else if (search == (XMLSearch *)0x0) {
    pcVar2 = strdup("");
    *xpath = pcVar2;
    if (*xpath == (SXML_CHAR *)0x0) {
      search_local = (XMLSearch *)0x0;
    }
    else {
      search_local = (XMLSearch *)*xpath;
    }
  }
  else {
    if (quote == '\0') {
      quote = 0x22;
    }
    fill._2_2_ = (ushort)(byte)quote;
    for (_i = search; _i != (XMLSearch *)0x0; _i = _i->next) {
      if ((_i != search) && (pSVar3 = strcat_alloc(xpath,"/"), pSVar3 == (SXML_CHAR *)0x0)) {
LAB_0010ae2e:
        free(*xpath);
        *xpath = (SXML_CHAR *)0x0;
        return (SXML_CHAR *)0x0;
      }
      if ((_i->tag == (SXML_CHAR *)0x0) || (*_i->tag == '\0')) {
        local_50 = "*";
      }
      else {
        local_50 = _i->tag;
      }
      pSVar3 = strcat_alloc(xpath,local_50);
      if ((pSVar3 == (SXML_CHAR *)0x0) ||
         (((0 < _i->n_attributes || ((_i->text != (SXML_CHAR *)0x0 && (*_i->text != '\0')))) &&
          (pSVar3 = strcat_alloc(xpath,"["), pSVar3 == (SXML_CHAR *)0x0)))) goto LAB_0010ae2e;
      bVar1 = false;
      if ((_i->text != (SXML_CHAR *)0x0) && (*_i->text != '\0')) {
        pSVar3 = strcat_alloc(xpath,".=");
        if ((pSVar3 == (SXML_CHAR *)0x0) ||
           (((pSVar3 = strcat_alloc(xpath,(SXML_CHAR *)((long)&fill + 2)),
             pSVar3 == (SXML_CHAR *)0x0 ||
             (pSVar3 = strcat_alloc(xpath,_i->text), pSVar3 == (SXML_CHAR *)0x0)) ||
            (pSVar3 = strcat_alloc(xpath,(SXML_CHAR *)((long)&fill + 2)), pSVar3 == (SXML_CHAR *)0x0
            )))) goto LAB_0010ae2e;
        bVar1 = true;
      }
      for (local_38 = 0; local_38 < _i->n_attributes; local_38 = local_38 + 1) {
        if (bVar1) {
          pSVar3 = strcat_alloc(xpath,", ");
          if (pSVar3 == (SXML_CHAR *)0x0) goto LAB_0010ae2e;
        }
        else {
          bVar1 = true;
        }
        pSVar3 = strcat_alloc(xpath,"@");
        if ((pSVar3 == (SXML_CHAR *)0x0) ||
           (pSVar3 = strcat_alloc(xpath,_i->attributes[local_38].name), pSVar3 == (SXML_CHAR *)0x0))
        goto LAB_0010ae2e;
        if (_i->attributes[local_38].value != (SXML_CHAR *)0x0) {
          pcVar2 = "!=";
          if (_i->attributes[local_38].active != 0) {
            pcVar2 = "=";
          }
          pSVar3 = strcat_alloc(xpath,pcVar2);
          if (((pSVar3 == (SXML_CHAR *)0x0) ||
              (pSVar3 = strcat_alloc(xpath,(SXML_CHAR *)((long)&fill + 2)),
              pSVar3 == (SXML_CHAR *)0x0)) ||
             ((pSVar3 = strcat_alloc(xpath,_i->attributes[local_38].value),
              pSVar3 == (SXML_CHAR *)0x0 ||
              (pSVar3 = strcat_alloc(xpath,(SXML_CHAR *)((long)&fill + 2)),
              pSVar3 == (SXML_CHAR *)0x0)))) goto LAB_0010ae2e;
        }
      }
      if ((((_i->text != (SXML_CHAR *)0x0) && (*_i->text != '\0')) || (0 < _i->n_attributes)) &&
         (pSVar3 = strcat_alloc(xpath,"]"), pSVar3 == (SXML_CHAR *)0x0)) goto LAB_0010ae2e;
    }
    search_local = (XMLSearch *)*xpath;
  }
  return (SXML_CHAR *)search_local;
}

Assistant:

SXML_CHAR* XMLSearch_get_XPath_string(const XMLSearch* search, SXML_CHAR** xpath, SXML_CHAR quote)
{
	const XMLSearch* s;
	SXML_CHAR squote[] = C2SX("'");
	int i, fill;

	if (xpath == NULL)
		return NULL;

	/* NULL 'search' is an empty string */
	if (search == NULL) {
		*xpath = sx_strdup(C2SX(""));
		if (*xpath == NULL)
			return NULL;

		return *xpath;
	}

	squote[0] = (quote == NULC ? XML_DEFAULT_QUOTE : quote);

	for (s = search; s != NULL; s = s->next) {
		if (s != search && strcat_alloc(xpath, C2SX("/")) == NULL) goto err; /* No "/" prefix for the first criteria */
		if (strcat_alloc(xpath, s->tag == NULL || s->tag[0] == NULC ? C2SX("*"): s->tag) == NULL) goto err;

		if (s->n_attributes > 0 || (s->text != NULL && s->text[0] != NULC))
			if (strcat_alloc(xpath, C2SX("[")) == NULL) goto err;

		fill = FALSE; /* '[' has not been filled with text yet, no ", " separator should be added */
		if (s->text != NULL && s->text[0] != NULC) {
			if (strcat_alloc(xpath, C2SX(".=")) == NULL) goto err;
			if (strcat_alloc(xpath, squote) == NULL) goto err;
			if (strcat_alloc(xpath, s->text) == NULL) goto err;
			if (strcat_alloc(xpath, squote) == NULL) goto err;
			fill = TRUE;
		}

		for (i = 0; i < s->n_attributes; i++) {
			if (fill) {
				if (strcat_alloc(xpath, C2SX(", ")) == NULL) goto err;
			} else
				fill = TRUE; /* filling is being performed */
			if (strcat_alloc(xpath, C2SX("@")) == NULL) goto err;
			if (strcat_alloc(xpath, s->attributes[i].name) == NULL) goto err;
			if (s->attributes[i].value == NULL) continue;

			if (strcat_alloc(xpath, s->attributes[i].active ? C2SX("=") : C2SX("!=")) == NULL) goto err;
			if (strcat_alloc(xpath, squote) == NULL) goto err;
			if (strcat_alloc(xpath, s->attributes[i].value) == NULL) goto err;
			if (strcat_alloc(xpath, squote) == NULL) goto err;
		}
		if ((s->text != NULL && s->text[0] != NULC) || s->n_attributes > 0) {
			if (strcat_alloc(xpath, C2SX("]")) == NULL) goto err;
		}
	}

	return *xpath;

err:
	__free(*xpath);
	*xpath = NULL;

	return NULL;
}